

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqast.cpp
# Opt level: O2

void __thiscall
SQCompilation::SwitchStatement::visitChildren(SwitchStatement *this,Visitor *visitor)

{
  Node *this_00;
  long lVar1;
  SwitchCase *c;
  SwitchCase *pSVar2;
  
  Node::visit<SQCompilation::Visitor>(&this->_expr->super_Node,visitor);
  pSVar2 = (this->_cases)._vals;
  for (lVar1 = (ulong)(this->_cases)._size << 4; lVar1 != 0; lVar1 = lVar1 + -0x10) {
    Node::visit<SQCompilation::Visitor>(&pSVar2->val->super_Node,visitor);
    Node::visit<SQCompilation::Visitor>(&pSVar2->stmt->super_Node,visitor);
    pSVar2 = pSVar2 + 1;
  }
  this_00 = &((this->_defaultCase).stmt)->super_Node;
  if (this_00 != (Node *)0x0) {
    Node::visit<SQCompilation::Visitor>(this_00,visitor);
    return;
  }
  return;
}

Assistant:

void SwitchStatement::visitChildren(Visitor *visitor) {
    _expr->visit(visitor);

    for (auto &c : cases()) {
        c.val->visit(visitor);
        c.stmt->visit(visitor);
    }

    if (_defaultCase.stmt) {
        _defaultCase.stmt->visit(visitor);
    }
}